

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

void __thiscall wavingz::demod::demod_nrz::operator()(demod_nrz *this,complex<double> iq)

{
  bool bVar1;
  optional<bool> *this_00;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  bool local_4c;
  undefined1 local_4b;
  optional<bool> local_4a;
  bool signal;
  double dStack_48;
  optional<bool> sample;
  double lock_freq;
  double s;
  double f;
  undefined8 local_28;
  demod_nrz *local_20;
  demod_nrz *this_local;
  complex<double> iq_local;
  
  local_20 = this;
  dVar2 = std::complex<double>::real_abi_cxx11_((complex<double> *)&this_local);
  dVar2 = iir_filter<6>::operator()(&this->lp1,dVar2);
  dVar3 = std::complex<double>::imag_abi_cxx11_((complex<double> *)&this_local);
  dVar3 = iir_filter<6>::operator()(&this->lp2,dVar3);
  std::complex<double>::complex((complex<double> *)&f,dVar2,dVar3);
  this_local = (demod_nrz *)f;
  iq_local._M_value._0_8_ = local_28;
  dVar2 = atan_fm_demodulator::operator()(&this->fsk_demod,(complex<double> *)&this_local);
  dVar3 = iir_filter<3>::operator()(&this->freq_filter,dVar2);
  dStack_48 = iir_filter<3>::operator()(&this->lock_filter,dVar2);
  this_00 = &local_4a;
  boost::optional<bool>::optional(this_00);
  std::abs((int)this_00);
  local_4b = 0.01 < extraout_XMM0_Qa;
  if ((bool)local_4b) {
    bVar1 = state_machine::sample_sm_t::idle(&this->samples_sm);
    if (bVar1) {
      this->omega_c = dStack_48;
    }
    local_4c = dVar3 - this->omega_c < 0.0;
    boost::optional<bool>::operator=(&local_4a,&local_4c);
    bVar1 = state_machine::sample_sm_t::preamble(&this->samples_sm);
    if (bVar1) {
      this->omega_c = this->omega_c * 0.95 + dStack_48 * 0.05;
    }
  }
  state_machine::sample_sm_t::process(&this->samples_sm,&local_4a);
  return;
}

Assistant:

void operator()(std::complex<double> iq)
    {
        iq = std::complex<double>(lp1(iq.real()), lp2(iq.imag()));
        double f = fsk_demod(iq);
        double s = freq_filter(f);
        double lock_freq = lock_filter(f);
        boost::optional<bool> sample;

        // check for signal, adjust central freq, and get sample
        bool signal = std::abs(lock_freq) > 0.01;
        if(signal)
        {
            if (samples_sm.idle()) omega_c = lock_freq;
            sample = (s - omega_c) < 0.0;
            if (samples_sm.preamble()) omega_c = 0.95 * omega_c + lock_freq * 0.05;
        }
        // process the sample with the state machine
        samples_sm.process(sample);
    }